

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::IsHDEnabled(CWallet *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  _Base_ptr p_Var3;
  byte bVar4;
  long in_FS_OFFSET;
  bool bVar5;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GetActiveScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_60,this);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  bVar5 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1;
  if (bVar5) {
    bVar5 = false;
  }
  else {
    bVar4 = 0;
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      cVar2 = (**(code **)(**(long **)(p_Var3 + 1) + 0x60))();
      if (cVar2 == '\0') break;
      bVar4 = 1;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
      bVar5 = (_Rb_tree_header *)p_Var3 == p_Var1;
    } while (!bVar5);
    bVar5 = (bool)(bVar5 & bVar4);
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CWallet::IsHDEnabled() const
{
    // All Active ScriptPubKeyMans must be HD for this to be true
    bool result = false;
    for (const auto& spk_man : GetActiveScriptPubKeyMans()) {
        if (!spk_man->IsHDEnabled()) return false;
        result = true;
    }
    return result;
}